

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  stress_instance *psVar2;
  ulong uVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong *puVar9;
  stress_instance *psVar10;
  ostream *poVar11;
  long *plVar12;
  size_t sVar13;
  long *plVar14;
  stress_instance *this;
  bool bVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  unique_ptr<stress_instance[],_std::default_delete<stress_instance[]>_> instances;
  unique_lock<std::mutex> lock;
  condition_variable dummyConditionVariable;
  mutex dummyMutex;
  double local_b8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
  local_b0;
  stress_instance *local_a8;
  ulong local_a0;
  unique_lock<std::mutex> local_98;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  __native_type local_58;
  
  if (argc < 2) {
    bVar15 = false;
    local_b8 = 1.0;
    uVar6 = 0;
  }
  else {
    local_b8 = 1.0;
    iVar8 = 1;
    uVar6 = 0;
    bVar15 = false;
    do {
      pcVar16 = argv[iVar8];
      iVar5 = strcmp(pcVar16,"-t");
      if (iVar5 == 0) {
        iVar8 = iVar8 + 1;
        if (argc <= iVar8) {
          pcVar16 = "Missing argument to thread count option (-t)";
LAB_00102981:
          poVar11 = std::operator<<((ostream *)&std::cerr,pcVar16);
          std::endl<char,std::char_traits<char>>(poVar11);
LAB_0010298e:
          exit(2);
        }
        uVar6 = atoi(argv[iVar8]);
      }
      else {
        iVar5 = strcmp(pcVar16,"-i");
        if (iVar5 == 0) {
          iVar8 = iVar8 + 1;
          if (argc <= iVar8) {
            pcVar16 = "Missing argument to iteration count option (-i)";
            goto LAB_00102981;
          }
          atoi(argv[iVar8]);
        }
        else {
          iVar5 = strcmp(pcVar16,"-d");
          if (iVar5 == 0) {
            iVar8 = iVar8 + 1;
            if (argc <= iVar8) {
              pcVar16 = "Missing argument to delay option (-d)";
              goto LAB_00102981;
            }
            dVar1 = atof(argv[iVar8]);
            uVar20 = SUB84(dVar1,0);
            uVar21 = (undefined4)((ulong)dVar1 >> 0x20);
            if (dVar1 <= 0.0) {
              uVar20 = 0;
              uVar21 = 0;
            }
            local_b8 = (double)CONCAT44(uVar21,uVar20);
          }
          else {
            iVar5 = strcmp(pcVar16,"-f");
            bVar15 = true;
            if (iVar5 != 0) {
              iVar8 = strcmp(pcVar16,"--help");
              if (iVar8 == 0) {
                poVar11 = std::operator<<((ostream *)&std::cerr,*argv);
                poVar11 = std::operator<<(poVar11," [-t threads] [-d delay] [-f]");
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::operator<<(poVar11,
                                          "threads is the number of CPUs to use. Default=0. 0=All");
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::operator<<(poVar11,"delay is the number of seconds between updates. "
                                         );
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::operator<<(poVar11,
                                          "Decimal fractions like 0.5 are allowed. Default=1.");
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                poVar11 = std::operator<<(poVar11,
                                          "Use -f to force it to use more than the number of CPUs");
                std::endl<char,std::char_traits<char>>(poVar11);
                exit(1);
              }
              local_58.__align = (long)&local_58.__data.__kind;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_58,"Invalid switch: ","");
              plVar12 = (long *)std::__cxx11::string::append(local_58.__size);
              local_88 = (long *)*plVar12;
              plVar14 = plVar12 + 2;
              if (local_88 == plVar14) {
                local_78 = *plVar14;
                lStack_70 = plVar12[3];
                local_88 = &local_78;
              }
              else {
                local_78 = *plVar14;
              }
              plVar4 = local_88;
              local_80 = plVar12[1];
              *plVar12 = (long)plVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if (local_88 == (long *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106170);
              }
              else {
                sVar13 = strlen((char *)local_88);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)plVar4,sVar13);
              }
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              goto LAB_0010298e;
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
  }
  uVar7 = std::thread::hardware_concurrency();
  if ((int)uVar6 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Using all ",10);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," CPUs",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    uVar6 = uVar7;
  }
  if ((ulong)uVar7 < (ulong)(long)(int)uVar6) {
    if (bVar15) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning, forced to use more threads than CPUs, ",0x2f);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," threads, but only ",0x13);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," CPUs detected!",0xf);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Capping to ",0xb);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,". Use -f to override.",0x15);
      uVar6 = uVar7;
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if (0x100 < uVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Capping to ",0xb);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,". Recompile with higher max_threads.",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    uVar6 = 0x100;
  }
  uVar17 = (ulong)uVar6;
  local_a0 = uVar17 * 0x98;
  puVar9 = (ulong *)operator_new__(local_a0 + 8);
  *puVar9 = uVar17;
  psVar10 = (stress_instance *)(puVar9 + 1);
  psVar2 = psVar10;
  local_a8 = psVar10;
  uVar19 = local_a0;
  uVar3 = uVar17;
  if (uVar6 != 0) {
    lVar18 = 0;
    this = psVar10;
    do {
      stress_instance::stress_instance(this);
      lVar18 = lVar18 + -0x98;
      this = this + 1;
      uVar19 = local_a0;
    } while (uVar17 * -0x98 - lVar18 != 0);
  }
  while (uVar3 != 0) {
    stress_instance::run(psVar2);
    uVar19 = uVar19 - 0x98;
    psVar2 = psVar2 + 1;
    uVar3 = uVar19;
  }
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)&local_88);
  local_98._M_owns = false;
  local_98._M_device = (mutex_type *)&local_58;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  lVar18 = std::chrono::_V2::system_clock::now();
  local_b0.__d.__r = (duration)((double)lVar18 / 1000000000.0);
  do {
    psVar2 = psVar10;
    uVar19 = local_a0;
    uVar3 = uVar17;
    if (0.0 < local_b8) {
      local_b0.__d.__r = (duration)((double)local_b0.__d.__r + local_b8);
      std::condition_variable::__wait_until_impl<std::chrono::duration<double,std::ratio<1l,1l>>>
                ((condition_variable *)&local_88,&local_98,&local_b0);
      uVar19 = local_a0;
    }
    while (uVar3 != 0) {
      *(undefined8 *)(std::thread::hardware_concurrency + *(long *)(std::cout + -0x18)) = 5;
      stress_instance::getCount(psVar2);
      poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"M ",2);
      uVar19 = uVar19 - 0x98;
      psVar2 = psVar2 + 1;
      uVar3 = uVar19;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int threads = 0;
    bool force = false;
    int timeLimit = -1;
    double interval = 1.0;

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp(argv[i], "-t"))
        {
            if (i + 1 >= argc)
                error("Missing argument to thread count option (-t)");
            threads = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-i"))
        {
            if (i + 1 >= argc)
                error("Missing argument to iteration count option (-i)");
            timeLimit = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-d"))
        {
            if (i + 1 >= argc)
                error("Missing argument to delay option (-d)");
            interval = (std::max)(0.0, atof(argv[++i]));
        }
        else if (!strcmp(argv[i], "-f"))
        {
            force = true;
        }
        else if (!strcmp(argv[i], "--help"))
        {
            std::cerr << argv[0] << " [-t threads] [-d delay] [-f]" << std::endl <<
                std::endl <<
                "threads is the number of CPUs to use. Default=0. 0=All" << std::endl <<
                std::endl <<
                "delay is the number of seconds between updates. " << std::endl <<
                "Decimal fractions like 0.5 are allowed. Default=1." << std::endl <<
                std::endl <<
                "Use -f to force it to use more than the number of CPUs" << std::endl;
            exit(1);
        }
        else
        {
            error((std::string("Invalid switch: ") + argv[i]).c_str());
        }
    }

    std::size_t cpuCount = std::thread::hardware_concurrency();

    if (threads <= 0)
    {
        std::cerr << "Using all " << cpuCount << " CPUs" << std::endl;
        threads = cpuCount;
    }

    if (threads > cpuCount)
    {
        if (force)
        {
            std::cerr << "Warning, forced to use more threads"
                         " than CPUs, " << threads << " threads,"
                         " but only " << cpuCount <<
                         " CPUs detected!" << std::endl;
        }
        else
        {
            std::cerr << "Capping to " << cpuCount <<
                    ". Use -f to override." << std::endl;
            threads = cpuCount;
        }
    }

    if (threads > max_threads)
    {
        std::cerr << "Capping to " << max_threads <<
                ". Recompile with higher max_threads." << std::endl;
        threads = max_threads;
    }

    return run_stress(threads, timeLimit, interval);
}